

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2wat.cc
# Opt level: O3

int ProgramMain(int argc,char **argv)

{
  code *pcVar1;
  _Alloc_hider _Var2;
  Result RVar3;
  Result RVar4;
  wabt *this;
  Callback *callback;
  uint uVar5;
  string_view filename;
  string_view filename_00;
  ValidateOptions options_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  Errors errors;
  ReadBinaryOptions options;
  OptionParser parser;
  _Any_data local_4b8;
  bool bStack_4a8;
  undefined2 uStack_4a7;
  undefined5 uStack_4a5;
  code *local_4a0;
  WriteWatOptions local_478;
  void *local_458;
  long lStack_450;
  long local_448;
  Errors local_438;
  undefined1 local_418 [19];
  undefined5 uStack_405;
  tuple<wabt::FileStream_*,_std::default_delete<wabt::FileStream>_> local_400;
  bool local_3f8;
  bool local_3f7;
  bool local_3f6;
  bool local_3f5;
  undefined1 local_3e8 [92];
  Index IStack_38c;
  Index IStack_388;
  undefined8 uStack_384;
  undefined1 local_378 [16];
  pointer local_368;
  __node_base_ptr *local_258;
  size_type local_250;
  __node_base local_248;
  size_type sStack_240;
  float local_238;
  size_t local_230;
  __node_base_ptr p_Stack_228;
  __node_base_ptr *local_220;
  size_type local_218;
  __node_base local_210;
  size_type sStack_208;
  float local_200;
  size_t local_1f8;
  __node_base_ptr p_Stack_1f0;
  __node_base_ptr *local_1e8;
  size_type local_1e0;
  __node_base local_1d8;
  size_type sStack_1d0;
  float local_1c8;
  size_t local_1c0;
  __node_base_ptr p_Stack_1b8;
  __node_base_ptr *local_1b0;
  size_type local_1a8;
  __node_base local_1a0;
  size_type sStack_198;
  float local_190;
  size_t local_188;
  __node_base_ptr p_Stack_180;
  __node_base_ptr *local_178;
  size_type local_170;
  __node_base local_168;
  size_type sStack_160;
  float local_158;
  size_t local_150;
  __node_base_ptr p_Stack_148;
  __node_base_ptr *local_140;
  size_type local_138;
  __node_base local_130;
  size_type sStack_128;
  float local_120;
  size_t local_118;
  __node_base_ptr p_Stack_110;
  __node_base_ptr *local_108;
  size_type local_100;
  __node_base local_f8;
  size_type sStack_f0;
  float local_e8;
  size_t local_e0;
  __node_base_ptr p_Stack_d8;
  __node_base_ptr *local_d0;
  size_type local_c8;
  __node_base local_c0;
  size_type sStack_b8;
  float local_b0;
  size_t local_a8;
  __node_base_ptr p_Stack_a0;
  __buckets_ptr local_98;
  size_type local_90;
  __node_base local_88;
  size_type sStack_80;
  float local_78;
  size_t local_70;
  undefined1 auStack_68 [24];
  _Rb_tree_node_base local_50;
  size_t local_30;
  
  wabt::InitStdio();
  wabt::OptionParser::OptionParser
            ((OptionParser *)local_3e8,"wasm2wat",
             "  Read a file in the WebAssembly binary format, and convert it to\n  the WebAssembly text format.\n\nexamples:\n  # parse binary file test.wasm and write text file test.wast\n  $ wasm2wat test.wasm -o test.wat\n\n  # parse test.wasm, write test.wat, but ignore the debug names, if any\n  $ wasm2wat test.wasm --no-debug-names -o test.wat\n"
            );
  local_4b8._M_unused._M_object = (void *)0x0;
  local_4b8._8_7_ = 0;
  local_4b8._M_pod_data[0xf] = '\0';
  local_4a0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2wat.cc:65:72)>
              ::_M_invoke;
  bStack_4a8 = true;
  uStack_4a7 = 0x1146;
  uStack_4a5 = 0;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_3e8,'v',"verbose","Use multiple times for more info",
             (NullCallback *)&local_4b8);
  pcVar1 = (code *)CONCAT53(uStack_4a5,CONCAT21(uStack_4a7,bStack_4a8));
  if (pcVar1 != (code *)0x0) {
    (*pcVar1)(&local_4b8,&local_4b8,3);
  }
  local_4b8._M_unused._M_object = (void *)0x0;
  local_4b8._8_7_ = 0;
  local_4b8._M_pod_data[0xf] = '\0';
  local_4a0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2wat.cc:72:7)>
              ::_M_invoke;
  bStack_4a8 = true;
  uStack_4a7 = 0x1146;
  uStack_4a5 = 0;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_3e8,'o',"output","FILENAME",
             "Output file for the generated wast file, by default use stdout",(Callback *)&local_4b8
            );
  pcVar1 = (code *)CONCAT53(uStack_4a5,CONCAT21(uStack_4a7,bStack_4a8));
  if (pcVar1 != (code *)0x0) {
    (*pcVar1)(&local_4b8,&local_4b8,3);
  }
  local_4b8._M_unused._M_object = (void *)0x0;
  local_4b8._8_7_ = 0;
  local_4b8._M_pod_data[0xf] = '\0';
  local_4a0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2wat.cc:77:20)>
              ::_M_invoke;
  bStack_4a8 = true;
  uStack_4a7 = 0x1146;
  uStack_4a5 = 0;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_3e8,'f',"fold-exprs","Write folded expressions where possible",
             (NullCallback *)&local_4b8);
  pcVar1 = (code *)CONCAT53(uStack_4a5,CONCAT21(uStack_4a7,bStack_4a8));
  if (pcVar1 != (code *)0x0) {
    (*pcVar1)(&local_4b8,&local_4b8,3);
  }
  wabt::Features::AddOptions(&s_features,(OptionParser *)local_3e8);
  local_4b8._M_unused._M_object = (void *)0x0;
  local_4b8._8_7_ = 0;
  local_4b8._M_pod_data[0xf] = '\0';
  local_4a0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2wat.cc:80:20)>
              ::_M_invoke;
  bStack_4a8 = true;
  uStack_4a7 = 0x1146;
  uStack_4a5 = 0;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_3e8,"inline-exports","Write all exports inline",
             (NullCallback *)&local_4b8);
  pcVar1 = (code *)CONCAT53(uStack_4a5,CONCAT21(uStack_4a7,bStack_4a8));
  if (pcVar1 != (code *)0x0) {
    (*pcVar1)(&local_4b8,&local_4b8,3);
  }
  local_4b8._M_unused._M_object = (void *)0x0;
  local_4b8._8_7_ = 0;
  local_4b8._M_pod_data[0xf] = '\0';
  local_4a0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2wat.cc:82:20)>
              ::_M_invoke;
  bStack_4a8 = true;
  uStack_4a7 = 0x1147;
  uStack_4a5 = 0;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_3e8,"inline-imports","Write all imports inline",
             (NullCallback *)&local_4b8);
  pcVar1 = (code *)CONCAT53(uStack_4a5,CONCAT21(uStack_4a7,bStack_4a8));
  if (pcVar1 != (code *)0x0) {
    (*pcVar1)(&local_4b8,&local_4b8,3);
  }
  local_4b8._M_unused._M_object = (void *)0x0;
  local_4b8._8_7_ = 0;
  local_4b8._M_pod_data[0xf] = '\0';
  local_4a0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2wat.cc:84:20)>
              ::_M_invoke;
  bStack_4a8 = true;
  uStack_4a7 = 0x1147;
  uStack_4a5 = 0;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_3e8,"no-debug-names","Ignore debug names in the binary file",
             (NullCallback *)&local_4b8);
  pcVar1 = (code *)CONCAT53(uStack_4a5,CONCAT21(uStack_4a7,bStack_4a8));
  if (pcVar1 != (code *)0x0) {
    (*pcVar1)(&local_4b8,&local_4b8,3);
  }
  local_4b8._M_unused._M_object = (void *)0x0;
  local_4b8._8_7_ = 0;
  local_4b8._M_pod_data[0xf] = '\0';
  local_4a0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2wat.cc:87:20)>
              ::_M_invoke;
  bStack_4a8 = true;
  uStack_4a7 = 0x1147;
  uStack_4a5 = 0;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_3e8,"ignore-custom-section-errors",
             "Ignore errors in custom sections",(NullCallback *)&local_4b8);
  pcVar1 = (code *)CONCAT53(uStack_4a5,CONCAT21(uStack_4a7,bStack_4a8));
  if (pcVar1 != (code *)0x0) {
    (*pcVar1)(&local_4b8,&local_4b8,3);
  }
  local_4b8._M_unused._M_object = (void *)0x0;
  local_4b8._8_7_ = 0;
  local_4b8._M_pod_data[0xf] = '\0';
  local_4a0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2wat.cc:91:7)>
              ::_M_invoke;
  bStack_4a8 = true;
  uStack_4a7 = 0x1147;
  uStack_4a5 = 0;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_3e8,"generate-names",
             "Give auto-generated names to non-named functions, types, etc.",
             (NullCallback *)&local_4b8);
  pcVar1 = (code *)CONCAT53(uStack_4a5,CONCAT21(uStack_4a7,bStack_4a8));
  if (pcVar1 != (code *)0x0) {
    (*pcVar1)(&local_4b8,&local_4b8,3);
  }
  local_4b8._M_unused._M_object = (void *)0x0;
  local_4b8._8_7_ = 0;
  local_4b8._M_pod_data[0xf] = '\0';
  local_4a0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2wat.cc:93:20)>
              ::_M_invoke;
  bStack_4a8 = true;
  uStack_4a7 = 0x1147;
  uStack_4a5 = 0;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_3e8,"no-check","Don\'t check for invalid modules",
             (NullCallback *)&local_4b8);
  pcVar1 = (code *)CONCAT53(uStack_4a5,CONCAT21(uStack_4a7,bStack_4a8));
  if (pcVar1 != (code *)0x0) {
    (*pcVar1)(&local_4b8,&local_4b8,3);
  }
  bStack_4a8 = true;
  uStack_4a7 = 0x6c69;
  uStack_4a5 = 0x656d616e65;
  local_4b8._M_pod_data[8] = true;
  local_4b8._M_pod_data[9] = false;
  local_4b8._M_pod_data[10] = false;
  local_4b8._M_pod_data[0xb] = false;
  local_4b8._M_pod_data[0xc] = false;
  local_4b8._M_pod_data[0xd] = false;
  local_4b8._M_pod_data[0xe] = false;
  local_4b8._M_pod_data[0xf] = '\0';
  local_4a0 = (code *)((ulong)local_4a0 & 0xffffffffffffff00);
  callback = (Callback *)local_418;
  local_418._0_8_ = (void *)0x0;
  local_418[8] = false;
  local_418[9] = false;
  local_418[10] = false;
  local_418[0xb] = false;
  local_418[0xc] = false;
  local_418[0xd] = false;
  local_418[0xe] = false;
  local_400.super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
  super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>)
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2wat.cc:95:22)>
       ::_M_invoke;
  local_418._15_4_ = 0x11481200;
  uStack_405 = 0;
  local_4b8._M_unused._M_object = &bStack_4a8;
  wabt::OptionParser::AddArgument((OptionParser *)local_3e8,(string *)&local_4b8,One,callback);
  if ((code *)CONCAT53(uStack_405,local_418._16_3_) != (code *)0x0) {
    (*(code *)CONCAT53(uStack_405,local_418._16_3_))(local_418,local_418,3);
  }
  if ((bool *)local_4b8._M_unused._0_8_ != &bStack_4a8) {
    operator_delete(local_4b8._M_unused._M_object,
                    CONCAT53(uStack_4a5,CONCAT21(uStack_4a7,bStack_4a8)) + 1);
  }
  wabt::OptionParser::Parse((OptionParser *)local_3e8,argc,argv);
  if (local_368 != (pointer)0x0) {
    (*(code *)local_368)(local_378,local_378,3);
  }
  std::vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::~vector
            ((vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_> *)
             (local_3e8 + 0x58));
  std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::~vector
            ((vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_> *)
             (local_3e8 + 0x40));
  if ((undefined1 *)local_3e8._32_8_ != local_3e8 + 0x30) {
    operator_delete((void *)local_3e8._32_8_,CONCAT71(local_3e8._49_7_,local_3e8[0x30]) + 1);
  }
  if ((undefined1 *)local_3e8._0_8_ != local_3e8 + 0x10) {
    operator_delete((void *)local_3e8._0_8_,CONCAT44(local_3e8._20_4_,local_3e8._16_4_) + 1);
  }
  _Var2._M_p = s_infile_abi_cxx11_._M_dataplus._M_p;
  local_458 = (void *)0x0;
  lStack_450 = 0;
  local_448 = 0;
  this = (wabt *)strlen(s_infile_abi_cxx11_._M_dataplus._M_p);
  filename._M_str = (char *)&local_458;
  filename._M_len = (size_t)_Var2._M_p;
  RVar3 = wabt::ReadFile(this,filename,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)callback);
  uVar5 = 1;
  if (RVar3.enum_ == Ok) {
    local_438.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_438.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_438.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3e8._16_4_ = 0;
    local_3e8._20_4_ = 0;
    local_3e8._24_4_ = 0;
    local_3e8._0_8_ = (pointer)0x0;
    local_3e8._8_4_ = 0;
    local_3e8._12_4_ = 0;
    local_3e8._40_8_ = 0;
    local_3e8[0x30] = '\0';
    local_3e8._64_8_ = (pointer)0x0;
    local_3e8._72_8_ = (pointer)0x0;
    local_3e8._80_8_ = (pointer)0x0;
    local_3e8._88_4_ = 0;
    IStack_38c = 0;
    IStack_388 = 0;
    uStack_384 = 0;
    local_3e8._32_8_ = local_3e8 + 0x30;
    memset(local_378,0,0x120);
    local_250 = 1;
    local_248._M_nxt = (_Hash_node_base *)0x0;
    sStack_240 = 0;
    local_238 = 1.0;
    local_230 = 0;
    p_Stack_228 = (__node_base_ptr)0x0;
    local_220 = &p_Stack_1f0;
    local_218 = 1;
    local_210._M_nxt = (_Hash_node_base *)0x0;
    sStack_208 = 0;
    local_200 = 1.0;
    local_1f8 = 0;
    p_Stack_1f0 = (__node_base_ptr)0x0;
    local_1e8 = &p_Stack_1b8;
    local_1e0 = 1;
    local_1d8._M_nxt = (_Hash_node_base *)0x0;
    sStack_1d0 = 0;
    local_1c8 = 1.0;
    local_1c0 = 0;
    p_Stack_1b8 = (__node_base_ptr)0x0;
    local_1b0 = &p_Stack_180;
    local_1a8 = 1;
    local_1a0._M_nxt = (_Hash_node_base *)0x0;
    sStack_198 = 0;
    local_190 = 1.0;
    local_188 = 0;
    p_Stack_180 = (__node_base_ptr)0x0;
    local_178 = &p_Stack_148;
    local_170 = 1;
    local_168._M_nxt = (_Hash_node_base *)0x0;
    sStack_160 = 0;
    local_158 = 1.0;
    local_150 = 0;
    p_Stack_148 = (__node_base_ptr)0x0;
    local_140 = &p_Stack_110;
    local_138 = 1;
    local_130._M_nxt = (_Hash_node_base *)0x0;
    sStack_128 = 0;
    local_120 = 1.0;
    local_118 = 0;
    p_Stack_110 = (__node_base_ptr)0x0;
    local_108 = &p_Stack_d8;
    local_100 = 1;
    local_f8._M_nxt = (_Hash_node_base *)0x0;
    sStack_f0 = 0;
    local_e8 = 1.0;
    local_e0 = 0;
    p_Stack_d8 = (__node_base_ptr)0x0;
    local_d0 = &p_Stack_a0;
    local_c8 = 1;
    local_c0._M_nxt = (_Hash_node_base *)0x0;
    sStack_b8 = 0;
    local_b0 = 1.0;
    local_a8 = 0;
    p_Stack_a0 = (__node_base_ptr)0x0;
    local_98 = (__buckets_ptr)auStack_68;
    local_90 = 1;
    local_88._M_nxt = (_Hash_node_base *)0x0;
    sStack_80 = 0;
    local_78 = 1.0;
    local_50._M_left = &local_50;
    RVar4.enum_ = Ok;
    local_50._M_color = _S_red;
    local_50._M_parent = (_Base_ptr)0x0;
    local_70 = 0;
    auStack_68._0_7_ = 0;
    auStack_68._7_4_ = 0;
    local_30 = 0;
    local_3f8 = (bool)(s_read_debug_names ^ 1);
    local_3f6 = (bool)(s_fail_on_custom_section_error ^ 1);
    local_418[0] = s_features.exceptions_enabled_;
    local_418[1] = s_features.mutable_globals_enabled_;
    local_418[2] = s_features.sat_float_to_int_enabled_;
    local_418[3] = s_features.sign_extension_enabled_;
    local_418[4] = s_features.simd_enabled_;
    local_418[5] = s_features.threads_enabled_;
    local_418[6] = s_features.function_references_enabled_;
    local_418[7] = s_features.multi_value_enabled_;
    local_418[8] = s_features.tail_call_enabled_;
    local_418[9] = s_features.bulk_memory_enabled_;
    local_418[10] = s_features.reference_types_enabled_;
    local_418[0xb] = s_features.annotations_enabled_;
    local_418[0xc] = s_features.code_metadata_enabled_;
    local_418[0xd] = s_features.gc_enabled_;
    local_418[0xe] = s_features.memory64_enabled_;
    local_418[0xf] = s_features.multi_memory_enabled_;
    local_418[0x10] = s_features.extended_const_enabled_;
    local_418[0x11] = s_features.relaxed_simd_enabled_;
    local_418[0x12] = s_features.custom_page_sizes_enabled_;
    local_400.super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
    super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>)
         (_Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>)
         s_log_stream._M_t.
         super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
         super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
         super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
    local_3f7 = true;
    local_3f5 = false;
    local_258 = &p_Stack_228;
    local_50._M_right = local_50._M_left;
    RVar3 = wabt::ReadBinaryIr(s_infile_abi_cxx11_._M_dataplus._M_p,local_458,
                               lStack_450 - (long)local_458,(ReadBinaryOptions *)local_418,
                               &local_438,(Module *)local_3e8);
    uVar5 = 1;
    if (RVar3.enum_ == Ok) {
      if (s_validate == '\0') {
        bStack_4a8 = s_features.extended_const_enabled_;
        uStack_4a7 = s_features._17_2_;
        local_4b8._M_unused._M_object = (void *)s_features._0_8_;
        local_4b8._M_pod_data[8] = s_features.tail_call_enabled_;
        local_4b8._M_pod_data[9] = s_features.bulk_memory_enabled_;
        local_4b8._M_pod_data[10] = s_features.reference_types_enabled_;
        local_4b8._M_pod_data[0xb] = s_features.annotations_enabled_;
        local_4b8._M_pod_data[0xc] = s_features.code_metadata_enabled_;
        local_4b8._M_pod_data[0xd] = s_features.gc_enabled_;
        local_4b8._M_pod_data[0xe] = s_features.memory64_enabled_;
        local_4b8._M_pod_data[0xf] = s_features.multi_memory_enabled_;
        RVar4 = wabt::ValidateModule((Module *)local_3e8,&local_438,(ValidateOptions *)&local_4b8);
      }
      if (s_generate_names == '\x01') {
        RVar4 = wabt::GenerateNames((Module *)local_3e8,None);
      }
      if (RVar4.enum_ == Ok) {
        wabt::ApplyNames((Module *)local_3e8);
        local_478.features.exceptions_enabled_ = s_features.exceptions_enabled_;
        local_478.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
        local_478.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
        local_478.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
        local_478.features.simd_enabled_ = s_features.simd_enabled_;
        local_478.features.threads_enabled_ = s_features.threads_enabled_;
        local_478.features.function_references_enabled_ = s_features.function_references_enabled_;
        local_478.features.multi_value_enabled_ = s_features.multi_value_enabled_;
        local_478.features.tail_call_enabled_ = s_features.tail_call_enabled_;
        local_478.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
        local_478.features.reference_types_enabled_ = s_features.reference_types_enabled_;
        local_478.features.annotations_enabled_ = s_features.annotations_enabled_;
        local_478.features.code_metadata_enabled_ = s_features.code_metadata_enabled_;
        local_478.features.gc_enabled_ = s_features.gc_enabled_;
        local_478.features.memory64_enabled_ = s_features.memory64_enabled_;
        local_478.features.multi_memory_enabled_ = s_features.multi_memory_enabled_;
        local_478.features.extended_const_enabled_ = s_features.extended_const_enabled_;
        local_478.features.relaxed_simd_enabled_ = s_features.relaxed_simd_enabled_;
        local_478.features.custom_page_sizes_enabled_ = s_features.custom_page_sizes_enabled_;
        local_478.fold_exprs = (bool)s_fold_exprs;
        local_478.inline_import = (bool)s_inline_import;
        local_478.inline_export = (bool)s_inline_export;
        if (s_outfile_abi_cxx11_._M_string_length == 0) {
          wabt::FileStream::FileStream((FileStream *)&local_4b8,_stdout,(Stream *)0x0);
        }
        else {
          filename_00._M_str = s_outfile_abi_cxx11_._M_dataplus._M_p;
          filename_00._M_len = s_outfile_abi_cxx11_._M_string_length;
          wabt::FileStream::FileStream((FileStream *)&local_4b8,filename_00,(Stream *)0x0);
        }
        RVar3 = wabt::WriteWat((Stream *)&local_4b8,(Module *)local_3e8,&local_478);
        wabt::FileStream::~FileStream((FileStream *)&local_4b8);
        uVar5 = (uint)(RVar3.enum_ != Ok);
      }
    }
    local_4b8._M_pod_data[8] = false;
    local_4b8._M_pod_data[9] = false;
    local_4b8._M_pod_data[10] = false;
    local_4b8._M_pod_data[0xb] = false;
    local_4b8._M_pod_data[0xc] = false;
    local_4b8._M_pod_data[0xd] = false;
    local_4b8._M_pod_data[0xe] = false;
    local_4b8._M_pod_data[0xf] = '\0';
    bStack_4a8 = false;
    local_4b8._M_unused._M_object = &bStack_4a8;
    wabt::FormatErrorsToFile
              (&local_438,Binary,(LexerSourceLineFinder *)0x0,_stderr,(string *)&local_4b8,Never,
               0x50);
    if ((bool *)local_4b8._M_unused._0_8_ != &bStack_4a8) {
      operator_delete(local_4b8._M_unused._M_object,
                      CONCAT53(uStack_4a5,CONCAT21(uStack_4a7,bStack_4a8)) + 1);
    }
    wabt::Module::~Module((Module *)local_3e8);
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&local_438);
  }
  if (local_458 != (void *)0x0) {
    operator_delete(local_458,local_448 - (long)local_458);
  }
  return uVar5;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  Result result;

  InitStdio();
  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  result = ReadFile(s_infile.c_str(), &file_data);
  if (Succeeded(result)) {
    Errors errors;
    Module module;
    const bool kStopOnFirstError = true;
    ReadBinaryOptions options(s_features, s_log_stream.get(),
                              s_read_debug_names, kStopOnFirstError,
                              s_fail_on_custom_section_error);
    result = ReadBinaryIr(s_infile.c_str(), file_data.data(), file_data.size(),
                          options, &errors, &module);
    if (Succeeded(result)) {
      if (Succeeded(result) && s_validate) {
        ValidateOptions options(s_features);
        result = ValidateModule(&module, &errors, options);
      }

      if (s_generate_names) {
        result = GenerateNames(&module);
      }

      if (Succeeded(result)) {
        /* TODO(binji): This shouldn't fail; if a name can't be applied
         * (because the index is invalid, say) it should just be skipped. */
        Result dummy_result = ApplyNames(&module);
        WABT_USE(dummy_result);
      }

      if (Succeeded(result)) {
        WriteWatOptions wat_options(s_features);
        wat_options.fold_exprs = s_fold_exprs;
        wat_options.inline_import = s_inline_import;
        wat_options.inline_export = s_inline_export;
        FileStream stream(!s_outfile.empty() ? FileStream(s_outfile)
                                             : FileStream(stdout));
        result = WriteWat(&stream, &module, wat_options);
      }
    }
    FormatErrorsToFile(errors, Location::Type::Binary);
  }
  return result != Result::Ok;
}